

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.h
# Opt level: O0

void __thiscall
pstack::Elf::GnuHash::GnuHash(GnuHash *this,csptr *hash_,csptr *syms_,csptr *strings_)

{
  element_type *this_00;
  Header HVar1;
  csptr *strings__local;
  csptr *syms__local;
  csptr *hash__local;
  GnuHash *this_local;
  
  std::shared_ptr<const_pstack::Reader>::shared_ptr(&this->hash,hash_);
  std::shared_ptr<const_pstack::Reader>::shared_ptr(&this->syms,syms_);
  std::shared_ptr<const_pstack::Reader>::shared_ptr(&this->strings,strings_);
  this_00 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  HVar1 = Reader::readObj<pstack::Elf::GnuHash::Header>(this_00,0);
  this->header = HVar1;
  return;
}

Assistant:

GnuHash(Reader::csptr hash_, Reader::csptr syms_, Reader::csptr strings_)
        : hash(std::move(hash_))
        , syms(std::move(syms_))
        , strings(std::move(strings_))
        , header(hash->readObj<Header>(0))
        {}